

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetGenexEvalNode::Evaluate
          (string *__return_storage_ptr__,TargetGenexEvalNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  bool evaluateForBuildsystem;
  string *input;
  pointer pbVar1;
  bool bVar2;
  cmGeneratorTarget *headTarget;
  ostream *poVar3;
  string local_258;
  pointer local_238;
  cmLocalGenerator *local_230;
  TargetGenexEvalNode *local_228;
  cmGeneratorExpressionDAGChecker *local_220;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_218;
  string local_208;
  string local_1e8;
  string local_1c8;
  cmGeneratorExpressionContext targetContext;
  
  input = (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_228 = this;
  local_220 = dagCheckerParent;
  if ((input->_M_string_length == 0) ||
     (bVar2 = cmGeneratorExpression::IsValidTargetName(input), !bVar2)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)&targetContext,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,
               "$<TARGET_GENEX_EVAL:tgt, ...> expression requires a non-empty valid target name.",
               (allocator<char> *)&local_208);
    reportError(context,(string *)&targetContext,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&targetContext);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  headTarget = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,input);
  if (headTarget == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&targetContext);
    poVar3 = std::operator<<((ostream *)&targetContext,"$<TARGET_GENEX_EVAL:tgt, ...> target \"");
    poVar3 = std::operator<<(poVar3,(string *)input);
    std::operator<<(poVar3,"\" not found.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_258,content);
    std::__cxx11::stringbuf::str();
    reportError(context,&local_258,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_258);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targetContext);
    return __return_storage_ptr__;
  }
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_238 = pbVar1 + 1;
  if (pbVar1[1]._M_string_length != 0) {
    local_230 = context->LG;
    std::__cxx11::string::string((string *)&local_1c8,(string *)&context->Config);
    bVar2 = context->Quiet;
    evaluateForBuildsystem = context->EvaluateForBuildsystem;
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_218,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)context);
    std::__cxx11::string::string((string *)&local_1e8,(string *)&context->Language);
    cmGeneratorExpressionContext::cmGeneratorExpressionContext
              (&targetContext,local_230,&local_1c8,bVar2,headTarget,headTarget,
               evaluateForBuildsystem,(cmListFileBacktrace *)&local_218,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"TARGET_GENEX_EVAL",(allocator<char> *)&local_208);
    GenexEvaluator::EvaluateExpression
              (__return_storage_ptr__,&local_228->super_GenexEvaluator,&local_258,local_238,
               &targetContext,content,local_220);
    std::__cxx11::string::~string((string *)&local_258);
    cmGeneratorExpressionContext::~cmGeneratorExpressionContext(&targetContext);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_238);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    const std::string& targetName = parameters.front();
    if (targetName.empty() ||
        !cmGeneratorExpression::IsValidTargetName(targetName)) {
      reportError(context, content->GetOriginalExpression(),
                  "$<TARGET_GENEX_EVAL:tgt, ...> expression requires a "
                  "non-empty valid target name.");
      return std::string();
    }

    const auto* target = context->LG->FindGeneratorTargetToUse(targetName);
    if (!target) {
      std::ostringstream e;
      e << "$<TARGET_GENEX_EVAL:tgt, ...> target \"" << targetName
        << "\" not found.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::string();
    }

    const std::string& expression = parameters[1];
    if (expression.empty()) {
      return expression;
    }

    cmGeneratorExpressionContext targetContext(
      context->LG, context->Config, context->Quiet, target, target,
      context->EvaluateForBuildsystem, context->Backtrace, context->Language);

    return this->EvaluateExpression("TARGET_GENEX_EVAL", expression,
                                    &targetContext, content, dagCheckerParent);
  }